

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int header_get_durable(HEADER_HANDLE header,_Bool *durable_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  HEADER_INSTANCE *header_instance;
  uint32_t item_count;
  int result;
  _Bool *durable_value_local;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance._4_4_ = 0x39c3;
  }
  else {
    _item_count = durable_value;
    durable_value_local = (_Bool *)header;
    iVar1 = amqpvalue_get_composite_item_count(header->composite_value,(uint32_t *)&header_instance)
    ;
    if (iVar1 == 0) {
      if ((int)header_instance == 0) {
        *_item_count = false;
        header_instance._4_4_ = 0;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(header->composite_value,0);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          *_item_count = false;
          header_instance._4_4_ = 0;
        }
        else {
          iVar1 = amqpvalue_get_boolean(value,_item_count);
          if (iVar1 == 0) {
            header_instance._4_4_ = 0;
          }
          else {
            AVar2 = amqpvalue_get_type(value);
            if (AVar2 == AMQP_TYPE_NULL) {
              *_item_count = false;
              header_instance._4_4_ = 0;
            }
            else {
              header_instance._4_4_ = 0x39e4;
            }
          }
        }
      }
    }
    else {
      header_instance._4_4_ = 0x39cb;
    }
  }
  return header_instance._4_4_;
}

Assistant:

int header_get_durable(HEADER_HANDLE header, bool* durable_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        if (amqpvalue_get_composite_item_count(header_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 0)
            {
                *durable_value = false;
                result = 0;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(header_instance->composite_value, 0);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    *durable_value = false;
                    result = 0;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_boolean(item_value, durable_value);
                    if (get_single_value_result != 0)
                    {
                        if (amqpvalue_get_type(item_value) != AMQP_TYPE_NULL)
                        {
                            result = MU_FAILURE;
                        }
                        else
                        {
                            *durable_value = false;
                            result = 0;
                        }
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}